

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

bool CreateStore(ExpressionEvalContext *ctx,ExprBase *target,ExprBase *value)

{
  TypeBase *pTVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  size_t __n;
  ExprRationalLiteral *expr;
  ExprBase *__src;
  char *msg;
  _func_int **__s;
  uint index;
  uint index_1;
  float tmp;
  undefined1 local_1c [8];
  float local_14;
  
  uVar3 = (ctx->stackFrames).count;
  if ((uVar3 != 0) && ((ctx->stackFrames).data[uVar3 - 1]->targetYield != 0)) {
    __assert_fail("ctx.stackFrames.back()->targetYield == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x79,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  if (target == (ExprBase *)0x0) {
LAB_0013424b:
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x84,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  if (target->typeID != 0xc) {
    if (target->typeID != 9) goto LAB_0013424b;
    msg = "ERROR: store to null pointer";
LAB_001340b6:
    Report(ctx,msg);
    return false;
  }
  __s = target[1]._vptr_ExprBase;
  pTVar1 = value->type;
  uVar5 = pTVar1->size;
  if (*(ulong *)&target[1].typeID < (long)__s + uVar5) {
    __assert_fail("ptr->ptr + value->type->size <= ptr->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x85,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
  }
  switch(value->typeID) {
  case 3:
  case 4:
    __src = (ExprBase *)&value->field_0x29;
    goto LAB_00134149;
  case 5:
    __src = (ExprBase *)value[1]._vptr_ExprBase;
    break;
  case 6:
    goto switchD_001340fe_caseD_6;
  case 7:
    if (pTVar1 != ctx->ctx->typeFloat) goto switchD_001340fe_caseD_6;
    local_14 = (float)(double)value[1]._vptr_ExprBase;
    __src = (ExprBase *)&local_14;
    break;
  case 8:
    pTVar1 = (TypeBase *)value[1]._vptr_ExprBase;
    if (((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID < 0x1d)) &&
       ((0x18000001U >> (pTVar1->typeID & 0x1f) & 1) != 0)) {
      return false;
    }
    local_1c._4_4_ = ExpressionContext::GetTypeIndex(ctx->ctx,pTVar1);
    __src = (ExprBase *)(local_1c + 4);
    __s = target[1]._vptr_ExprBase;
    __n = (size_t)(uint)value->type->size;
    goto LAB_00134200;
  case 9:
    memset(__s,0,uVar5 & 0xffffffff);
    return true;
  case 10:
    if ((FunctionData *)value[1]._vptr_ExprBase == (FunctionData *)0x0) {
      local_1c._0_4_ = 0;
    }
    else {
      uVar3 = ExpressionContext::GetFunctionIndex(ctx->ctx,(FunctionData *)value[1]._vptr_ExprBase);
      local_1c._0_4_ = uVar3 + 1;
      __s = target[1]._vptr_ExprBase;
      uVar5 = (ulong)(uint)value->type->size;
    }
    __src = (ExprBase *)local_1c;
    break;
  case 0xb:
    if ((FunctionData *)value[1]._vptr_ExprBase == (FunctionData *)0x0) {
      iVar4 = 0;
    }
    else {
      uVar3 = ExpressionContext::GetFunctionIndex(ctx->ctx,(FunctionData *)value[1]._vptr_ExprBase);
      iVar4 = uVar3 + 1;
      __s = target[1]._vptr_ExprBase;
    }
    *(int *)__s = iVar4;
    lVar2 = *(long *)&value[1].typeID;
    if (lVar2 == 0) {
      return false;
    }
    if (*(int *)(lVar2 + 8) == 0xc) {
      *(undefined8 *)((long)target[1]._vptr_ExprBase + 4) = *(undefined8 *)(lVar2 + 0x30);
      return true;
    }
    if (*(int *)(lVar2 + 8) == 9) {
      *(undefined8 *)((long)target[1]._vptr_ExprBase + 4) = 0;
      return true;
    }
    return false;
  case 0xc:
    if (pTVar1->typeID != 0x12) {
      __assert_fail("ptrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xda,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
    }
    if (*(_func_int **)&value[1].typeID <
        (_func_int *)((long)value[1]._vptr_ExprBase + (long)pTVar1[1]._vptr_TypeBase[6])) {
      __assert_fail("expr->ptr + ptrType->subType->size <= expr->end",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xdb,"bool CreateStore(ExpressionEvalContext &, ExprBase *, ExprBase *)");
    }
    goto switchD_001340fe_caseD_6;
  case 0xd:
    __src = (ExprBase *)value[1]._vptr_ExprBase[6];
    break;
  default:
    msg = "ERROR: unknown store type";
    goto LAB_001340b6;
  }
  __n = uVar5 & 0xffffffff;
LAB_00134200:
  memcpy(__s,__src,__n);
  return true;
switchD_001340fe_caseD_6:
  __src = value + 1;
LAB_00134149:
  __n = uVar5 & 0xffffffff;
  goto LAB_00134200;
}

Assistant:

bool CreateStore(ExpressionEvalContext &ctx, ExprBase *target, ExprBase *value)
{
	// No side-effects while coroutine is skipping to target node
	if(!ctx.stackFrames.empty())
		assert(ctx.stackFrames.back()->targetYield == 0);

	if(isType<ExprNullptrLiteral>(target))
	{
		Report(ctx, "ERROR: store to null pointer");

		return false;
	}

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(target);

	assert(ptr);
	assert(ptr->ptr + value->type->size <= ptr->end);

	if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprCharacterLiteral *expr = getType<ExprCharacterLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprStringLiteral *expr = getType<ExprStringLiteral>(value))
	{
		memcpy(ptr->ptr, expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
	{
		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
	{
		if(expr->type == ctx.ctx.typeFloat)
		{
			float tmp = float(expr->value);
			memcpy(ptr->ptr, &tmp, unsigned(value->type->size));
			return true;
		}

		memcpy(ptr->ptr, &expr->value, unsigned(value->type->size));
		return true;
	}

	if(ExprTypeLiteral *expr = getType<ExprTypeLiteral>(value))
	{
		if(isType<TypeError>(expr->value))
			return false;

		if(isType<TypeArgumentSet>(expr->value) || isType<TypeMemberSet>(expr->value))
			return false;

		unsigned index = ctx.ctx.GetTypeIndex(expr->value);
		memcpy(ptr->ptr, &index, unsigned(value->type->size));
		return true;
	}

	if(isType<ExprNullptrLiteral>(value))
	{
		memset(ptr->ptr, 0, unsigned(value->type->size));
		return true;
	}

	if(ExprFunctionIndexLiteral *expr = getType<ExprFunctionIndexLiteral>(value))
	{
		unsigned index = expr->function ? ctx.ctx.GetFunctionIndex(expr->function) + 1 : 0;
		memcpy(ptr->ptr, &index, unsigned(value->type->size));
		return true;
	}

	if(ExprFunctionLiteral *expr = getType<ExprFunctionLiteral>(value))
	{
		unsigned index = expr->data ? ctx.ctx.GetFunctionIndex(expr->data) + 1 : 0;
		memcpy(ptr->ptr, &index, sizeof(unsigned));

		if(isType<ExprNullptrLiteral>(expr->context))
			memset(ptr->ptr + 4, 0, sizeof(void*));
		else if(ExprPointerLiteral *context = getType<ExprPointerLiteral>(expr->context))
			memcpy(ptr->ptr + 4, &context->ptr, sizeof(void*));
		else
			return false;

		return true;
	}

	if(ExprPointerLiteral *expr = getType<ExprPointerLiteral>(value))
	{
		TypeRef *ptrType = getType<TypeRef>(expr->type);

		(void)ptrType;
		assert(ptrType);
		assert(expr->ptr + ptrType->subType->size <= expr->end);

		memcpy(ptr->ptr, &expr->ptr, unsigned(value->type->size));
		return true;
	}

	if(ExprMemoryLiteral *expr = getType<ExprMemoryLiteral>(value))
	{
		memcpy(ptr->ptr, expr->ptr->ptr, unsigned(value->type->size));
		return true;
	}

	Report(ctx, "ERROR: unknown store type");

	return false;
}